

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O0

void __thiscall
backward::TraceResolverLinuxImpl<backward::trace_resolver_tag::backtrace_symbol>::load_addresses
          (TraceResolverLinuxImpl<backward::trace_resolver_tag::backtrace_symbol> *this,
          void **addresses,int address_count)

{
  int in_EDX;
  undefined8 in_RSI;
  char **in_stack_00000008;
  undefined4 in_stack_00000010;
  
  if (in_EDX != 0) {
    backtrace_symbols(in_RSI,in_EDX);
    details::handle<char_**,_backward::details::deleter<void,_void_*,_&free>_>::reset
              ((handle<char_**,_backward::details::deleter<void,_void_*,_&free>_> *)
               CONCAT44(address_count,in_stack_00000010),in_stack_00000008);
  }
  return;
}

Assistant:

void load_addresses(void *const*addresses, int address_count) override {
    if (address_count == 0) {
      return;
    }
    _symbols.reset(backtrace_symbols(addresses, address_count));
  }